

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_5::writeTileData
               (OutputStreamMutex *streamData,Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,
               int pixelDataSize)

{
  int iVar1;
  OStream *out;
  Int64 *pIVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_stack_00000008;
  Int64 currentPosition;
  undefined8 in_stack_ffffffffffffffc8;
  OStream *pOVar3;
  
  out = *(OStream **)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  if (out == (OStream *)0x0) {
    out = (OStream *)(**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
  }
  pOVar3 = out;
  pIVar2 = TileOffsets::operator()
                     ((TileOffsets *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,(int)((ulong)out >> 0x20)
                      ,(int)out);
  *pIVar2 = (Int64)out;
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(out,iVar1);
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
            (*(long **)(in_RDI + 0x28),in_stack_00000008,(int)currentPosition);
  iVar1 = Xdr::size<int>();
  *(long *)(in_RDI + 0x30) =
       (long)&pOVar3->_vptr_OStream + (long)(int)currentPosition + (long)(iVar1 * 5);
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    iVar1 = Xdr::size<int>();
    *(long *)(in_RDI + 0x30) = (long)iVar1 + *(long *)(in_RDI + 0x30);
  }
  return;
}

Assistant:

void
writeTileData (OutputStreamMutex *streamData,
               TiledOutputFile::Data *ofd,
               int dx, int dy,
	       int lx, int ly, 
               const char pixelData[],
               int pixelDataSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    Int64 currentPosition = streamData->currentPosition;
    streamData->currentPosition = 0;

    if (currentPosition == 0)
        currentPosition = streamData->os->tellp();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

    #ifdef DEBUG
	assert (streamData->os->tellp() == currentPosition);
    #endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write <StreamIO> (*streamData->os, ofd->partNumber);
    }
    Xdr::write <StreamIO> (*streamData->os, dx);
    Xdr::write <StreamIO> (*streamData->os, dy);
    Xdr::write <StreamIO> (*streamData->os, lx);
    Xdr::write <StreamIO> (*streamData->os, ly);
    Xdr::write <StreamIO> (*streamData->os, pixelDataSize);

    streamData->os->write (pixelData, pixelDataSize);

    //
    // Keep current position in the file so that we can avoid 
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    streamData->currentPosition = currentPosition +
                           5 * Xdr::size<int>() +
                           pixelDataSize;

    if (ofd->multipart)
    {
        streamData->currentPosition += Xdr::size<int>();
    }
}